

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

string * __thiscall
(anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
          (string *__return_storage_ptr__,void *this,MetaData *metadata)

{
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  string key;
  Values values;
  ostringstream stream;
  char *local_208;
  long local_200;
  char local_1f8 [16];
  string *local_1e8;
  _Rb_tree_node_base *local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar2 = Typelib::MetaData::get_abi_cxx11_();
  p_Var5 = *(_Rb_tree_node_base **)(lVar2 + 0x18);
  local_1e8 = __return_storage_ptr__;
  if (p_Var5 != (_Rb_tree_node_base *)(lVar2 + 8)) {
    local_1e0 = (_Rb_tree_node_base *)(lVar2 + 8);
    do {
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_1d8,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var5 + 2));
      p_Var4 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_1d8._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"<metadata key=\"",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" />",4);
      }
      else {
        for (; (_Rb_tree_header *)p_Var4 != &local_1d8._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"<metadata key=\"",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208,local_200);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"><![CDATA[",0xb);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]]></metadata>\n",0xf);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1d8);
      if (local_208 != local_1f8) {
        operator_delete(local_208);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_1e0);
  }
  psVar1 = local_1e8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string TlbExportVisitor::emitMetaData(MetaData const& metadata) const
    {
        std::ostringstream stream;
        MetaData::Map const& map = metadata.get();
        for (MetaData::Map::const_iterator it = map.begin(); it != map.end(); ++it)
        {
            std::string key = it->first;
            MetaData::Values values = it->second;
            if (values.empty())
            {
                stream << "<metadata key=\"" << key << "\" />";
            }
            else
            {
                for (MetaData::Values::const_iterator it_value = values.begin(); it_value != values.end(); ++it_value)
                    stream << "<metadata key=\"" << key << "\"><![CDATA[" << *it_value << "]]></metadata>\n";
            }
        }
        return stream.str();
    }